

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O1

anytype_t * ps_config_set(ps_config_t *config,char *name,anytype_t *val,ps_type_t t)

{
  ps_arg_t *ppVar1;
  int iVar2;
  ulong val_00;
  anytype_t *paVar3;
  anytype_t *paVar4;
  char *pcVar5;
  long ln;
  ps_arg_t *ppVar6;
  
  if (val != (anytype_t *)0x0) {
    if ((t & ARG_STRING) != 0) {
      paVar3 = ps_config_set_str(config,name,(char *)val->ptr);
      return paVar3;
    }
    if ((t & ARG_INTEGER) == 0) {
      if ((t & ARG_BOOLEAN) == 0) {
        if ((t & ARG_FLOATING) == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                  ,0x28b,"Value has unknown type %d\n",name);
          return (anytype_t *)0x0;
        }
        val_00 = (ulong)((int)val->fl != 0);
      }
      else {
        val_00 = (ulong)(*(int *)val != 0);
      }
    }
    else {
      val_00 = val->i;
    }
    paVar3 = ps_config_set_int(config,name,val_00);
    return paVar3;
  }
  paVar3 = &cmd_ln_access_r(config,name)->val;
  if (paVar3 == (anytype_t *)0x0) {
    pcVar5 = "Unknown parameter %s\n";
    ln = 0x269;
  }
  else {
    ppVar6 = config->defn;
    pcVar5 = ppVar6->name;
    while (pcVar5 != (char *)0x0) {
      iVar2 = strcmp(pcVar5,name);
      if (iVar2 == 0) {
        paVar4 = anytype_from_str(paVar3,*(int *)(paVar3 + 1),ppVar6->deflt);
        if (paVar4 == (anytype_t *)0x0) {
          return (anytype_t *)0x0;
        }
        break;
      }
      ppVar1 = ppVar6 + 1;
      ppVar6 = ppVar6 + 1;
      pcVar5 = ppVar1->name;
    }
    if (ppVar6->name != (char *)0x0) {
      return paVar3;
    }
    pcVar5 = "No definition found for %s\n";
    ln = 0x275;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
          ,ln,pcVar5,name);
  return (anytype_t *)0x0;
}

Assistant:

const anytype_t *
ps_config_set(ps_config_t *config, const char *name, const anytype_t *val, ps_type_t t)
{
    if (val == NULL) {
        /* Restore default parameter */
        return ps_config_unset(config, name);
    }
    else if (t & ARG_STRING)
        return ps_config_set_str(config, name, val->ptr);
    else if (t & ARG_INTEGER)
        return ps_config_set_int(config, name, val->i);
    else if (t & ARG_BOOLEAN)
        return ps_config_set_bool(config, name, val->i);
    else if (t & ARG_FLOATING)
        return ps_config_set_bool(config, name, val->fl);
    else {
        E_ERROR("Value has unknown type %d\n", name, t);
        return NULL;
    }
}